

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O0

void lwsl_hexdump_level(int hexdump_level,void *vbuf,size_t len)

{
  uint uVar1;
  int iVar2;
  char *local_90;
  char *p;
  char line [80];
  uint m;
  uint start;
  uint n;
  uchar *buf;
  size_t len_local;
  void *vbuf_local;
  int hexdump_level_local;
  
  iVar2 = lwsl_visible(hexdump_level);
  if (iVar2 != 0) {
    if (len == 0) {
      _lws_log(hexdump_level,"(hexdump: zero length)\n");
    }
    else if (vbuf == (void *)0x0) {
      _lws_log(hexdump_level,"(hexdump: trying to dump %d at NULL)\n",len & 0xffffffff);
    }
    else {
      _lws_log(hexdump_level,"\n");
      m = 0;
      while (uVar1 = m, m < len) {
        iVar2 = lws_snprintf((char *)&p,10,"%04X: ",(ulong)m);
        local_90 = (char *)((long)&p + (long)iVar2);
        line[0x4c] = '\0';
        line[0x4d] = '\0';
        line[0x4e] = '\0';
        line[0x4f] = '\0';
        for (; (uint)line._76_4_ < 0x10 && m < len; line._76_4_ = line._76_4_ + 1) {
          iVar2 = lws_snprintf(local_90,5,"%02X ",(ulong)*(byte *)((long)vbuf + (ulong)m));
          local_90 = local_90 + iVar2;
          m = m + 1;
        }
        while ((uint)line._76_4_ < 0x10) {
          line._76_4_ = line._76_4_ + 1;
          iVar2 = lws_snprintf(local_90,5,"   ");
          local_90 = local_90 + iVar2;
        }
        line._76_4_ = line._76_4_ + 1;
        iVar2 = lws_snprintf(local_90,6,"   ");
        local_90 = local_90 + iVar2;
        line[0x4c] = '\0';
        line[0x4d] = '\0';
        line[0x4e] = '\0';
        line[0x4f] = '\0';
        for (; (uint)line._76_4_ < 0x10 && uVar1 + line._76_4_ < len; line._76_4_ = line._76_4_ + 1)
        {
          if ((*(byte *)((long)vbuf + (ulong)(uVar1 + line._76_4_)) < 0x20) ||
             (0x7e < *(byte *)((long)vbuf + (ulong)(uVar1 + line._76_4_)))) {
            *local_90 = '.';
          }
          else {
            *local_90 = *(char *)((long)vbuf + (ulong)(uVar1 + line._76_4_));
          }
          local_90 = local_90 + 1;
        }
        while ((uint)line._76_4_ < 0x10) {
          line._76_4_ = line._76_4_ + 1;
          *local_90 = ' ';
          local_90 = local_90 + 1;
        }
        line._76_4_ = line._76_4_ + 1;
        *local_90 = '\n';
        local_90[1] = '\0';
        _lws_log(hexdump_level,"%s",&p);
      }
      _lws_log(hexdump_level,"\n");
    }
  }
  return;
}

Assistant:

void
lwsl_hexdump_level(int hexdump_level, const void *vbuf, size_t len)
{
	unsigned char *buf = (unsigned char *)vbuf;
	unsigned int n;

	if (!lwsl_visible(hexdump_level))
		return;

	if (!len) {
		_lws_log(hexdump_level, "(hexdump: zero length)\n");
		return;
	}

	if (!vbuf) {
		_lws_log(hexdump_level, "(hexdump: trying to dump %d at NULL)\n",
					(int)len);
		return;
	}

	_lws_log(hexdump_level, "\n");

	for (n = 0; n < len;) {
		unsigned int start = n, m;
		char line[80], *p = line;

		p += lws_snprintf(p, 10, "%04X: ", start);

		for (m = 0; m < 16 && n < len; m++)
			p += lws_snprintf(p, 5, "%02X ", buf[n++]);
		while (m++ < 16)
			p += lws_snprintf(p, 5, "   ");

		p += lws_snprintf(p, 6, "   ");

		for (m = 0; m < 16 && (start + m) < len; m++) {
			if (buf[start + m] >= ' ' && buf[start + m] < 127)
				*p++ = buf[start + m];
			else
				*p++ = '.';
		}
		while (m++ < 16)
			*p++ = ' ';

		*p++ = '\n';
		*p = '\0';
		_lws_log(hexdump_level, "%s", line);
		(void)line;
	}

	_lws_log(hexdump_level, "\n");
}